

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

qsizetype QtPrivate::indexOf<QSslError,QSslError>
                    (QList<QSslError> *vector,QSslError *u,qsizetype from)

{
  ulong uVar1;
  char cVar2;
  ulong uVar3;
  long lVar4;
  qsizetype qVar5;
  QSslError *this;
  long lVar6;
  
  uVar1 = (vector->d).size;
  uVar3 = from;
  if (from < 0) {
    uVar3 = from + uVar1;
    if ((long)(from + uVar1) < 1) {
      uVar3 = 0;
    }
  }
  qVar5 = -1;
  if (uVar3 < uVar1) {
    this = (vector->d).ptr + uVar3 * 8;
    lVar4 = 8 - (long)this;
    lVar6 = uVar1 * 8 + uVar3 * -8;
    do {
      if (lVar6 == 0) {
        return -1;
      }
      cVar2 = QSslError::operator==(this,u);
      lVar4 = lVar4 + -8;
      this = this + 8;
      lVar6 = lVar6 + -8;
    } while (cVar2 == '\0');
    qVar5 = -(long)((vector->d).ptr + lVar4) >> 3;
  }
  return qVar5;
}

Assistant:

qsizetype indexOf(const QList<T> &vector, const U &u, qsizetype from) noexcept
{
    if (from < 0)
        from = qMax(from + vector.size(), qsizetype(0));
    if (from < vector.size()) {
        auto n = vector.begin() + from - 1;
        auto e = vector.end();
        while (++n != e)
            if (*n == u)
                return qsizetype(n - vector.begin());
    }
    return -1;
}